

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_cast.hpp
# Opt level: O3

bool boost::unit_test::utils::string_as<unsigned_int>(const_string *str,uint *res)

{
  uint uVar1;
  istringstream buff;
  long *local_1b0 [2];
  long local_1a0 [2];
  long local_190 [4];
  uint auStack_170 [22];
  ios_base local_118 [264];
  
  local_1b0[0] = local_1a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,str->m_begin,str->m_end);
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)local_1b0,_S_in);
  if (local_1b0[0] != local_1a0) {
    operator_delete(local_1b0[0],local_1a0[0] + 1);
  }
  std::istream::_M_extract<unsigned_int>((uint *)local_190);
  uVar1 = *(uint *)((long)auStack_170 + *(long *)(local_190[0] + -0x18));
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return (uVar1 & 7) == 2;
}

Assistant:

inline bool
string_as( const_string str, T& res )
{
    std::istringstream buff( std::string( str.begin(), str.end() ) );
    buff >> res;

    return !buff.fail() && buff.eof();
}